

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

size_t __thiscall capnp::_::ReaderArena::sizeInWords(ReaderArena *this)

{
  SegmentReader *pSVar1;
  uint i;
  SegmentId id;
  size_t unaff_R14;
  size_t sVar2;
  size_t sVar3;
  
  id.value = 1;
  sVar3 = (this->segment0).ptr.size_;
  do {
    sVar2 = sVar3;
    pSVar1 = tryGetSegment(this,id);
    sVar3 = sVar2;
    if (pSVar1 != (SegmentReader *)0x0) {
      sVar3 = sVar2 + (uint)(pSVar1->ptr).size_;
      sVar2 = unaff_R14;
    }
    id.value = id.value + 1;
    unaff_R14 = sVar2;
  } while (pSVar1 != (SegmentReader *)0x0);
  return sVar2;
}

Assistant:

size_t ReaderArena::sizeInWords() {
  size_t total = segment0.getArray().size();

  for (uint i = 1; ; i++) {
    SegmentReader* segment = tryGetSegment(SegmentId(i));
    if (segment == nullptr) return total;
    total += unboundAs<size_t>(segment->getSize() / WORDS);
  }
}